

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  int iVar6;
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char cVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong *puVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vint4 ai_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vint4 ai_3;
  undefined1 auVar27 [16];
  vint4 ai;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 ai_2;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_7;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_5;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  vint4 bi;
  vint4 bi_2;
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar24._4_4_ = fVar2;
  auVar24._0_4_ = fVar2;
  auVar24._8_4_ = fVar2;
  auVar24._12_4_ = fVar2;
  fVar50 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar27._4_4_ = fVar50;
  auVar27._0_4_ = fVar50;
  auVar27._8_4_ = fVar50;
  auVar27._12_4_ = fVar50;
  uVar3 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar54 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar35._4_4_ = fVar54;
  auVar35._0_4_ = fVar54;
  auVar35._8_4_ = fVar54;
  auVar35._12_4_ = fVar54;
  fVar55 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar38._4_4_ = fVar55;
  auVar38._0_4_ = fVar55;
  auVar38._8_4_ = fVar55;
  auVar38._12_4_ = fVar55;
  fVar56 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar41._4_4_ = fVar56;
  auVar41._0_4_ = fVar56;
  auVar41._8_4_ = fVar56;
  auVar41._12_4_ = fVar56;
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar6 = (tray->tnear).field_0.i[k];
  auVar42._4_4_ = iVar6;
  auVar42._0_4_ = iVar6;
  auVar42._8_4_ = iVar6;
  auVar42._12_4_ = iVar6;
  iVar6 = (tray->tfar).field_0.i[k];
  auVar43._4_4_ = iVar6;
  auVar43._0_4_ = iVar6;
  auVar43._8_4_ = iVar6;
  auVar43._12_4_ = iVar6;
  auVar45._0_4_ = fVar54 * -fVar1;
  auVar45._4_4_ = fVar54 * -fVar1;
  auVar45._8_4_ = fVar54 * -fVar1;
  auVar45._12_4_ = fVar54 * -fVar1;
  auVar47._0_4_ = fVar55 * -fVar2;
  auVar47._4_4_ = fVar55 * -fVar2;
  auVar47._8_4_ = fVar55 * -fVar2;
  auVar47._12_4_ = fVar55 * -fVar2;
  auVar49._0_4_ = fVar56 * -fVar50;
  auVar49._4_4_ = fVar56 * -fVar50;
  auVar49._8_4_ = fVar56 * -fVar50;
  auVar49._12_4_ = fVar56 * -fVar50;
  puVar19 = local_7d0;
LAB_0159874b:
  puVar18 = puVar19;
  if (puVar18 == &local_7d8) {
LAB_01598c01:
    return puVar18 != &local_7d8;
  }
  puVar19 = puVar18 + -1;
  uVar15 = puVar18[-1];
  do {
    fVar2 = *(float *)(ray + k * 4 + 0x70);
    auVar21._4_4_ = fVar2;
    auVar21._0_4_ = fVar2;
    auVar21._8_4_ = fVar2;
    auVar21._12_4_ = fVar2;
    fVar50 = 1.0 - fVar2;
    auVar52 = ZEXT1664(CONCAT412(fVar50,CONCAT48(fVar50,CONCAT44(fVar50,fVar50))));
    do {
      if ((uVar15 & 8) != 0) {
        cVar11 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 0x18))
                           (pre,ray,k,context);
        if (cVar11 == '\0') goto LAB_0159874b;
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_01598c01;
      }
      uVar13 = (uint)uVar15 & 7;
      uVar12 = uVar15 & 0xfffffffffffffff0;
      if (uVar13 == 3) {
        auVar25 = *(undefined1 (*) [16])(uVar12 + 0x80);
        auVar29 = *(undefined1 (*) [16])(uVar12 + 0x90);
        auVar30 = auVar52._0_16_;
        auVar44._0_4_ = fVar5 * auVar25._0_4_;
        auVar44._4_4_ = fVar5 * auVar25._4_4_;
        auVar44._8_4_ = fVar5 * auVar25._8_4_;
        auVar44._12_4_ = fVar5 * auVar25._12_4_;
        auVar46._0_4_ = fVar5 * auVar29._0_4_;
        auVar46._4_4_ = fVar5 * auVar29._4_4_;
        auVar46._8_4_ = fVar5 * auVar29._8_4_;
        auVar46._12_4_ = fVar5 * auVar29._12_4_;
        auVar10._4_4_ = uVar4;
        auVar10._0_4_ = uVar4;
        auVar10._8_4_ = uVar4;
        auVar10._12_4_ = uVar4;
        auVar26 = vfmadd231ps_fma(auVar44,auVar10,*(undefined1 (*) [16])(uVar12 + 0x50));
        auVar44 = vfmadd231ps_fma(auVar46,auVar10,*(undefined1 (*) [16])(uVar12 + 0x60));
        auVar9._4_4_ = uVar3;
        auVar9._0_4_ = uVar3;
        auVar9._8_4_ = uVar3;
        auVar9._12_4_ = uVar3;
        auVar36 = vfmadd231ps_fma(auVar26,auVar9,*(undefined1 (*) [16])(uVar12 + 0x20));
        auVar44 = vfmadd231ps_fma(auVar44,auVar9,*(undefined1 (*) [16])(uVar12 + 0x30));
        auVar48._8_4_ = 0x7fffffff;
        auVar48._0_8_ = 0x7fffffff7fffffff;
        auVar48._12_4_ = 0x7fffffff;
        auVar26 = vandps_avx(auVar36,auVar48);
        auVar28._8_4_ = 0x219392ef;
        auVar28._0_8_ = 0x219392ef219392ef;
        auVar28._12_4_ = 0x219392ef;
        auVar26 = vcmpps_avx(auVar26,auVar28,1);
        auVar36 = vblendvps_avx(auVar36,auVar28,auVar26);
        auVar26 = vandps_avx(auVar44,auVar48);
        auVar26 = vcmpps_avx(auVar26,auVar28,1);
        auVar7 = vblendvps_avx(auVar44,auVar28,auVar26);
        auVar26 = *(undefined1 (*) [16])(uVar12 + 0xa0);
        auVar51._0_4_ = fVar5 * auVar26._0_4_;
        auVar51._4_4_ = fVar5 * auVar26._4_4_;
        auVar51._8_4_ = fVar5 * auVar26._8_4_;
        auVar51._12_4_ = fVar5 * auVar26._12_4_;
        auVar44 = vfmadd231ps_fma(auVar51,auVar10,*(undefined1 (*) [16])(uVar12 + 0x70));
        auVar10 = vfmadd231ps_fma(auVar44,auVar9,*(undefined1 (*) [16])(uVar12 + 0x40));
        auVar44 = vandps_avx(auVar10,auVar48);
        auVar44 = vcmpps_avx(auVar44,auVar28,1);
        auVar44 = vblendvps_avx(auVar10,auVar28,auVar44);
        auVar10 = vrcpps_avx(auVar36);
        auVar22._8_4_ = 0x3f800000;
        auVar22._0_8_ = 0x3f8000003f800000;
        auVar22._12_4_ = 0x3f800000;
        auVar36 = vfnmadd213ps_fma(auVar36,auVar10,auVar22);
        auVar10 = vfmadd132ps_fma(auVar36,auVar10,auVar10);
        auVar36 = vrcpps_avx(auVar7);
        auVar7 = vfnmadd213ps_fma(auVar7,auVar36,auVar22);
        auVar9 = vfmadd132ps_fma(auVar7,auVar36,auVar36);
        auVar36 = vrcpps_avx(auVar44);
        auVar44 = vfnmadd213ps_fma(auVar44,auVar36,auVar22);
        auVar22 = vfmadd132ps_fma(auVar44,auVar36,auVar36);
        auVar25 = vfmadd213ps_fma(auVar25,auVar27,*(undefined1 (*) [16])(uVar12 + 0xb0));
        auVar44 = vfmadd231ps_fma(auVar25,auVar24,*(undefined1 (*) [16])(uVar12 + 0x50));
        auVar25 = vfmadd213ps_fma(auVar29,auVar27,*(undefined1 (*) [16])(uVar12 + 0xc0));
        auVar29 = vfmadd213ps_fma(auVar26,auVar27,*(undefined1 (*) [16])(uVar12 + 0xd0));
        auVar25 = vfmadd231ps_fma(auVar25,auVar24,*(undefined1 (*) [16])(uVar12 + 0x60));
        auVar29 = vfmadd231ps_fma(auVar29,auVar24,*(undefined1 (*) [16])(uVar12 + 0x70));
        auVar53 = ZEXT1664(auVar30);
        auVar39._0_4_ = fVar2 * *(float *)(uVar12 + 0xe0);
        auVar39._4_4_ = fVar2 * *(float *)(uVar12 + 0xe4);
        auVar39._8_4_ = fVar2 * *(float *)(uVar12 + 0xe8);
        auVar39._12_4_ = fVar2 * *(float *)(uVar12 + 0xec);
        auVar7._4_4_ = fVar1;
        auVar7._0_4_ = fVar1;
        auVar7._8_4_ = fVar1;
        auVar7._12_4_ = fVar1;
        auVar26 = vfmadd231ps_fma(auVar44,auVar7,*(undefined1 (*) [16])(uVar12 + 0x20));
        auVar36._0_4_ = fVar2 * *(float *)(uVar12 + 0xf0);
        auVar36._4_4_ = fVar2 * *(float *)(uVar12 + 0xf4);
        auVar36._8_4_ = fVar2 * *(float *)(uVar12 + 0xf8);
        auVar36._12_4_ = fVar2 * *(float *)(uVar12 + 0xfc);
        auVar44 = vfmadd231ps_fma(auVar25,auVar7,*(undefined1 (*) [16])(uVar12 + 0x30));
        auVar33._0_4_ = fVar2 * *(float *)(uVar12 + 0x100);
        auVar33._4_4_ = fVar2 * *(float *)(uVar12 + 0x104);
        auVar33._8_4_ = fVar2 * *(float *)(uVar12 + 0x108);
        auVar33._12_4_ = fVar2 * *(float *)(uVar12 + 0x10c);
        auVar23 = ZEXT816(0);
        auVar25 = vfmadd231ps_fma(auVar39,auVar30,auVar23);
        auVar36 = vfmadd231ps_fma(auVar36,auVar30,auVar23);
        auVar7 = vfmadd231ps_fma(auVar29,auVar7,*(undefined1 (*) [16])(uVar12 + 0x40));
        fVar50 = auVar52._0_4_;
        auVar29._0_4_ = fVar50 + fVar2 * *(float *)(uVar12 + 0x110);
        fVar54 = auVar52._4_4_;
        auVar29._4_4_ = fVar54 + fVar2 * *(float *)(uVar12 + 0x114);
        fVar55 = auVar52._8_4_;
        auVar29._8_4_ = fVar55 + fVar2 * *(float *)(uVar12 + 0x118);
        fVar56 = auVar52._12_4_;
        auVar29._12_4_ = fVar56 + fVar2 * *(float *)(uVar12 + 0x11c);
        auVar25 = vsubps_avx(auVar25,auVar26);
        auVar29 = vsubps_avx(auVar29,auVar26);
        auVar23 = vfmadd231ps_fma(auVar33,auVar30,auVar23);
        auVar30._0_4_ = fVar50 + fVar2 * *(float *)(uVar12 + 0x120);
        auVar30._4_4_ = fVar54 + fVar2 * *(float *)(uVar12 + 0x124);
        auVar30._8_4_ = fVar55 + fVar2 * *(float *)(uVar12 + 0x128);
        auVar30._12_4_ = fVar56 + fVar2 * *(float *)(uVar12 + 300);
        auVar26 = vsubps_avx(auVar36,auVar44);
        auVar44 = vsubps_avx(auVar30,auVar44);
        auVar31._0_4_ = fVar50 + fVar2 * *(float *)(uVar12 + 0x130);
        auVar31._4_4_ = fVar54 + fVar2 * *(float *)(uVar12 + 0x134);
        auVar31._8_4_ = fVar55 + fVar2 * *(float *)(uVar12 + 0x138);
        auVar31._12_4_ = fVar56 + fVar2 * *(float *)(uVar12 + 0x13c);
        auVar36 = vsubps_avx(auVar23,auVar7);
        auVar7 = vsubps_avx(auVar31,auVar7);
        auVar40._0_4_ = auVar10._0_4_ * auVar25._0_4_;
        auVar40._4_4_ = auVar10._4_4_ * auVar25._4_4_;
        auVar40._8_4_ = auVar10._8_4_ * auVar25._8_4_;
        auVar40._12_4_ = auVar10._12_4_ * auVar25._12_4_;
        auVar23._0_4_ = auVar10._0_4_ * auVar29._0_4_;
        auVar23._4_4_ = auVar10._4_4_ * auVar29._4_4_;
        auVar23._8_4_ = auVar10._8_4_ * auVar29._8_4_;
        auVar23._12_4_ = auVar10._12_4_ * auVar29._12_4_;
        auVar37._0_4_ = auVar9._0_4_ * auVar26._0_4_;
        auVar37._4_4_ = auVar9._4_4_ * auVar26._4_4_;
        auVar37._8_4_ = auVar9._8_4_ * auVar26._8_4_;
        auVar37._12_4_ = auVar9._12_4_ * auVar26._12_4_;
        auVar34._0_4_ = auVar22._0_4_ * auVar36._0_4_;
        auVar34._4_4_ = auVar22._4_4_ * auVar36._4_4_;
        auVar34._8_4_ = auVar22._8_4_ * auVar36._8_4_;
        auVar34._12_4_ = auVar22._12_4_ * auVar36._12_4_;
        auVar26._0_4_ = auVar9._0_4_ * auVar44._0_4_;
        auVar26._4_4_ = auVar9._4_4_ * auVar44._4_4_;
        auVar26._8_4_ = auVar9._8_4_ * auVar44._8_4_;
        auVar26._12_4_ = auVar9._12_4_ * auVar44._12_4_;
        auVar32._0_4_ = auVar22._0_4_ * auVar7._0_4_;
        auVar32._4_4_ = auVar22._4_4_ * auVar7._4_4_;
        auVar32._8_4_ = auVar22._8_4_ * auVar7._8_4_;
        auVar32._12_4_ = auVar22._12_4_ * auVar7._12_4_;
        auVar25 = vpminsd_avx(auVar37,auVar26);
        auVar29 = vpminsd_avx(auVar34,auVar32);
        auVar25 = vmaxps_avx(auVar25,auVar29);
        auVar36 = vpminsd_avx(auVar40,auVar23);
        auVar44 = vpmaxsd_avx(auVar40,auVar23);
        auVar29 = vpmaxsd_avx(auVar37,auVar26);
        auVar26 = vpmaxsd_avx(auVar34,auVar32);
        auVar26 = vminps_avx(auVar29,auVar26);
        auVar29 = vmaxps_avx(auVar42,auVar36);
        auVar25 = vmaxps_avx(auVar29,auVar25);
        auVar29 = vminps_avx(auVar43,auVar44);
        auVar29 = vminps_avx(auVar29,auVar26);
        auVar25 = vcmpps_avx(auVar25,auVar29,2);
      }
      else {
        auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar16),auVar21,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + uVar16));
        auVar25 = vfmadd213ps_fma(auVar25,auVar35,auVar45);
        auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar20),auVar21,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + uVar20));
        auVar29 = vfmadd213ps_fma(auVar29,auVar38,auVar47);
        auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar17),auVar21,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + uVar17));
        auVar25 = vpmaxsd_avx(auVar25,auVar29);
        auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar16 ^ 0x10)),auVar21,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar16 ^ 0x10)));
        auVar44 = vfmadd213ps_fma(auVar26,auVar41,auVar49);
        auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar20 ^ 0x10)),auVar21,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar20 ^ 0x10)));
        auVar29 = vfmadd213ps_fma(auVar29,auVar35,auVar45);
        auVar26 = vfmadd213ps_fma(auVar26,auVar38,auVar47);
        auVar26 = vpminsd_avx(auVar29,auVar26);
        auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar17 ^ 0x10)),auVar21,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar17 ^ 0x10)));
        auVar36 = vfmadd213ps_fma(auVar29,auVar41,auVar49);
        auVar29 = vpmaxsd_avx(auVar44,auVar42);
        auVar25 = vpmaxsd_avx(auVar25,auVar29);
        auVar29 = vpminsd_avx(auVar36,auVar43);
        auVar29 = vpminsd_avx(auVar26,auVar29);
        auVar25 = vcmpps_avx(auVar25,auVar29,2);
        auVar53 = auVar52;
        if (uVar13 == 6) {
          auVar29 = vcmpps_avx(*(undefined1 (*) [16])(uVar12 + 0xe0),auVar21,2);
          auVar26 = vcmpps_avx(auVar21,*(undefined1 (*) [16])(uVar12 + 0xf0),1);
          auVar29 = vandps_avx(auVar29,auVar26);
          auVar25 = vandps_avx(auVar29,auVar25);
        }
      }
      auVar25 = vpslld_avx(auVar25,0x1f);
      uVar13 = vmovmskps_avx(auVar25);
      if (uVar13 == 0) goto LAB_0159874b;
      uVar13 = uVar13 & 0xff;
      lVar8 = 0;
      for (uVar15 = (ulong)uVar13; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
        lVar8 = lVar8 + 1;
      }
      uVar15 = *(ulong *)(uVar12 + lVar8 * 8);
      uVar13 = uVar13 - 1 & uVar13;
      uVar14 = (ulong)uVar13;
      auVar52 = auVar53;
    } while (uVar13 == 0);
    do {
      *puVar19 = uVar15;
      puVar19 = puVar19 + 1;
      lVar8 = 0;
      for (uVar15 = uVar14; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
        lVar8 = lVar8 + 1;
      }
      uVar14 = uVar14 - 1 & uVar14;
      uVar15 = *(ulong *)(uVar12 + lVar8 * 8);
    } while (uVar14 != 0);
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }